

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_map.h
# Opt level: O1

void __thiscall
lemon::
ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
::ArrayMap(ArrayMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
           *this,GraphType *graph)

{
  Value *pVVar1;
  Container *pCVar2;
  Value *pVVar3;
  int iVar4;
  
  (this->super_ObserverBase)._notifier = (Notifier *)0x0;
  (this->super_ObserverBase)._index._M_node = (_List_node_base *)0x0;
  (this->super_ObserverBase)._vptr_ObserverBase = (_func_int **)&PTR__ArrayMap_0016f288;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc>
  ::attach(&graph->arc_notifier,&this->super_ObserverBase);
  allocate_memory(this);
  pCVar2 = ((this->super_ObserverBase)._notifier)->container;
  iVar4 = (int)((ulong)((long)(pCVar2->super_SmartDigraphBase)._arcs.
                              super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pCVar2->super_SmartDigraphBase)._arcs.
                             super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (iVar4 != 0) {
    pVVar3 = this->values;
    do {
      iVar4 = iVar4 + -1;
      pVVar1 = pVVar3 + iVar4;
      (pVVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (pVVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pVVar3[iVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

explicit ArrayMap(const GraphType& graph) {
    Parent::attach(graph.notifier(Item()));
    allocate_memory();
    Notifier* nf = Parent::notifier();
    Item      it;
    for (nf->first(it); it != INVALID; nf->next(it)) {
      int id = nf->id(it);
      ;
      AllocatorTraits::construct(allocator, &(values[id]), Value());
    }
  }